

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::swap
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *other)

{
  undefined8 uVar1;
  int64_t iVar2;
  json_storage_kind jVar3;
  bool bVar4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RSI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> temp;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffd0;
  
  if (in_RDI == in_RSI) {
    return;
  }
  jVar3 = storage_kind(in_RDI);
  bVar4 = is_trivial_storage(jVar3);
  if (bVar4) {
    jVar3 = storage_kind(in_RSI);
    bVar4 = is_trivial_storage(jVar3);
    if (bVar4) {
      basic_json(in_stack_ffffffffffffffd0);
      uVar1 = *(undefined8 *)&in_RSI->field_0;
      iVar2 = (in_RSI->field_0).int64_.val_;
      *(undefined8 *)&in_RSI->field_0 = *(undefined8 *)&in_RDI->field_0;
      (in_RSI->field_0).int64_.val_ = (in_RDI->field_0).int64_.val_;
      *(undefined8 *)&in_RDI->field_0 = uVar1;
      (in_RDI->field_0).int64_.val_ = iVar2;
      ~basic_json((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                  0x1c1ec9);
      return;
    }
  }
  jVar3 = storage_kind(in_RDI);
  (*(code *)(&DAT_00ea3f38 + *(int *)(&DAT_00ea3f38 + (ulong)jVar3 * 4)))();
  return;
}

Assistant:

void swap(basic_json& other) noexcept
        {
            if (this == &other)
            {
                return;
            }
            if (is_trivial_storage(storage_kind()) && is_trivial_storage(other.storage_kind()))
            {
                basic_json temp;               
                std::memcpy(static_cast<void*>(&temp), static_cast<void*>(&other), sizeof(basic_json));
                std::memcpy(static_cast<void*>(&other), static_cast<void*>(this), sizeof(basic_json));
                std::memcpy(static_cast<void*>(this), static_cast<void*>(&temp), sizeof(basic_json));
            }
            else
            {
                switch (storage_kind())
                {
                    case json_storage_kind::null: swap_l<null_storage>(other); break;
                    case json_storage_kind::empty_object : swap_l<empty_object_storage>(other); break;
                    case json_storage_kind::boolean: swap_l<bool_storage>(other); break;
                    case json_storage_kind::int64: swap_l<int64_storage>(other); break;
                    case json_storage_kind::uint64: swap_l<uint64_storage>(other); break;
                    case json_storage_kind::half_float: swap_l<half_storage>(other); break;
                    case json_storage_kind::float64: swap_l<double_storage>(other); break;
                    case json_storage_kind::short_str: swap_l<short_string_storage>(other); break;
                    case json_storage_kind::long_str: swap_l<long_string_storage>(other); break;
                    case json_storage_kind::byte_str: swap_l<byte_string_storage>(other); break;
                    case json_storage_kind::array: swap_l<array_storage>(other); break;
                    case json_storage_kind::object: swap_l<object_storage>(other); break;
                    case json_storage_kind::json_const_reference: swap_l<json_const_reference_storage>(other); break;
                    case json_storage_kind::json_reference: swap_l<json_reference_storage>(other); break;
                    default:
                        JSONCONS_UNREACHABLE();
                        break;
                }
            }
        }